

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentStack.h
# Opt level: O1

int __thiscall ConcurrentStack<int>::top(ConcurrentStack<int> *this)

{
  int iVar1;
  long lVar2;
  _Elt_pointer piVar3;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_48;
  undefined1 local_40 [8];
  unique_lock<std::mutex> mlock;
  
  local_40 = (undefined1  [8])&this->mutex_;
  mlock._M_device._0_1_ = 0;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_40);
  mlock._M_device._0_1_ = 1;
  piVar3 = (this->stack_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar3 == (this->stack_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Can\'t read : queue is empty !",0x1d);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
      std::ostream::put(-0x68);
      std::ostream::flush();
      if ((this->timeout_).__r == 0) {
        std::condition_variable::wait((unique_lock *)&this->queue_empty_);
      }
      else {
        lVar2 = std::chrono::_V2::steady_clock::now();
        local_48.__d.__r = (duration)((this->timeout_).__r * 1000000 + lVar2);
        std::condition_variable::
        __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                  (&this->queue_empty_,(unique_lock<std::mutex> *)local_40,&local_48);
      }
      piVar3 = (this->stack_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
    } while (piVar3 == (this->stack_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                       super__Deque_impl_data._M_start._M_cur);
  }
  if (piVar3 == (this->stack_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar3 = (this->stack_).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  iVar1 = piVar3[-1];
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_40);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
  return iVar1;
}

Assistant:

T top() {
        std::unique_lock<std::mutex> mlock(mutex_);
        while (stack_.empty()){
            std::cout << "Can't read : queue is empty !" << std::endl;
            if(timeout_ == std::chrono::milliseconds(0))
                queue_empty_.wait(mlock);
            else
                queue_empty_.wait_for(mlock, timeout_);
        }
        auto item = stack_.top();
        mlock.unlock();
        queue_full_.notify_one();
        return item;
    }